

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O2

int Gia_ManComputeEdgeDelay2(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *vFanMax1;
  Vec_Int_t *vFanMax2;
  Vec_Int_t *vCountMax;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pObj;
  int iVar4;
  
  vFanMax1 = Vec_IntStart(p->nObjs);
  vFanMax2 = Vec_IntStart(p->nObjs);
  vCountMax = Vec_IntStart(p->nObjs);
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                  ,0x23e,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
  }
  Vec_IntFreeP(&p->vEdgeDelay);
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  pVVar3 = Vec_IntStart(p->nObjs);
  p->vEdgeDelay = pVVar3;
  pVVar3 = Vec_IntStart(p->nObjs);
  p->vEdge1 = pVVar3;
  pVVar3 = Vec_IntStart(p->nObjs);
  p->vEdge2 = pVVar3;
  if (p->vMapping == (Vec_Int_t *)0x0) {
    if (p->vMapping2 == (Vec_Wec_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEdge.c"
                    ,0x24d,"int Gia_ManComputeEdgeDelay2(Gia_Man_t *)");
    }
    iVar4 = p->nObjs;
    while (1 < iVar4) {
      iVar4 = iVar4 + -1;
      iVar1 = Gia_ObjIsLut2(p,iVar4);
      if (iVar1 != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,iVar4,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,vFanMax2,vCountMax);
      }
    }
  }
  else {
    iVar4 = p->nObjs;
    while (1 < iVar4) {
      iVar4 = iVar4 + -1;
      iVar1 = Gia_ObjIsLut(p,iVar4);
      if (iVar1 != 0) {
        Gia_ObjComputeEdgeDelay2
                  (p,iVar4,p->vEdgeDelay,p->vEdge1,p->vEdge2,vFanMax1,vFanMax2,vCountMax);
      }
    }
  }
  iVar4 = 0;
  for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,iVar1);
    pObj = Gia_ManObj(p,iVar2);
    iVar2 = Gia_ObjId(p,pObj);
    if (iVar2 == 0) break;
    iVar2 = Vec_IntEntry(p->vEdgeDelay,iVar2);
    if (iVar4 <= iVar2) {
      iVar4 = iVar2;
    }
  }
  Vec_IntFree(vFanMax1);
  Vec_IntFree(vFanMax2);
  Vec_IntFree(vCountMax);
  return iVar4;
}

Assistant:

int Gia_ManComputeEdgeDelay2( Gia_Man_t * p )
{
    int k, iLut, DelayMax = 0;
    Vec_Int_t * vFanMax1 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vFanMax2 = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCountMax = Vec_IntStart( Gia_ManObjNum(p) );
    assert( p->pManTime == NULL );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    p->vEdgeDelay = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge1 = Vec_IntStart( Gia_ManObjNum(p) );
    p->vEdge2 = Vec_IntStart( Gia_ManObjNum(p) );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelay, iLut, 1 );
    if ( Gia_ManHasMapping(p) )
        Gia_ManForEachLutReverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else if ( Gia_ManHasMapping2(p) )
        Gia_ManForEachLut2Reverse( p, iLut )
            Gia_ObjComputeEdgeDelay2( p, iLut, p->vEdgeDelay, p->vEdge1, p->vEdge2, vFanMax1, vFanMax2, vCountMax );
    else assert( 0 );
    Gia_ManForEachCiId( p, iLut, k )
        DelayMax = Abc_MaxInt( DelayMax, Vec_IntEntry(p->vEdgeDelay, iLut) );
    Vec_IntFree( vFanMax1 );
    Vec_IntFree( vFanMax2 );
    Vec_IntFree( vCountMax );
    //printf( "The number of edges = %d.  Delay = %d.\n", Gia_ManEvalEdgeCount(p), DelayMax );
    return DelayMax;
}